

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void rw::Engine::term(void)

{
  FILE *__stream;
  char *pcVar1;
  int in_ESI;
  PluginList *in_RDI;
  Error local_10;
  Error _e;
  
  if ((engine == 0) && (state == 1)) {
    PluginList::close(in_RDI,in_ESI);
    d3d::nativeRasterOffset = 0;
    state = 0;
  }
  else {
    local_10.plugin = 0;
    local_10.code = 0x80000001;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/engine.cpp",0x14c);
    __stream = _stderr;
    pcVar1 = dbgsprint(0x80000001);
    fprintf(__stream,"%s\n",pcVar1);
    setError(&local_10);
  }
  return;
}

Assistant:

void
Engine::term(void)
{
	if(engine || Engine::state != Initialized){
		RWERROR((ERR_GENERAL));
		return;
	}

	PluginList::close();

	// This has to be reset because it won't be opened again otherwise
	// TODO: maybe reset more stuff here?
	d3d::nativeRasterOffset = 0;

	Engine::state = Dead;
}